

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O0

int str_packsize(lua_State *L)

{
  KOption KVar1;
  size_t sStack_40;
  KOption opt;
  size_t size;
  size_t sStack_30;
  uint ntoalign;
  size_t totalsize;
  char *fmt;
  Header h;
  lua_State *L_local;
  
  h._8_8_ = L;
  totalsize = (size_t)luaL_checklstring(L,1,(size_t *)0x0);
  sStack_30 = 0;
  initheader((lua_State *)h._8_8_,(Header *)&fmt);
  while (*(char *)totalsize != '\0') {
    KVar1 = getdetails((Header *)&fmt,sStack_30,(char **)&totalsize,&stack0xffffffffffffffc0,
                       (uint *)((long)&size + 4));
    if (KVar1 == Kstring || KVar1 == Kzstr) {
      luaL_argerror((lua_State *)h._8_8_,1,"variable-length format");
    }
    sStack_40 = size._4_4_ + sStack_40;
    if (0x7fffffffffffffff - sStack_40 < sStack_30) {
      luaL_argerror((lua_State *)h._8_8_,1,"format result too large");
    }
    sStack_30 = sStack_40 + sStack_30;
  }
  lua_pushinteger((lua_State *)h._8_8_,sStack_30);
  return 1;
}

Assistant:

static int str_packsize (lua_State *L) {
  Header h;
  const char *fmt = luaL_checkstring(L, 1);  /* format string */
  size_t totalsize = 0;  /* accumulate total size of result */
  initheader(L, &h);
  while (*fmt != '\0') {
    unsigned ntoalign;
    size_t size;
    KOption opt = getdetails(&h, totalsize, &fmt, &size, &ntoalign);
    luaL_argcheck(L, opt != Kstring && opt != Kzstr, 1,
                     "variable-length format");
    size += ntoalign;  /* total space used by option */
    luaL_argcheck(L, totalsize <= LUA_MAXINTEGER - size,
                     1, "format result too large");
    totalsize += size;
  }
  lua_pushinteger(L, cast_st2S(totalsize));
  return 1;
}